

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

string * __thiscall
mp::GenericVarNamer::vname_abi_cxx11_(string *__return_storage_ptr__,GenericVarNamer *this,int i)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,(int)this + 1);
  std::operator+(__return_storage_ptr__,"x",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string vname(int i)
  { return "x" + std::to_string(i+1); }